

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

SSL_SESSION * GetSessionCallback(SSL *ssl,uint8_t *data,int len,int *copy)

{
  bool bVar1;
  TestState *pTVar2;
  TestState *async_state;
  int *copy_local;
  int len_local;
  uint8_t *data_local;
  SSL *ssl_local;
  
  pTVar2 = GetTestState(ssl);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pTVar2->session);
  if (bVar1) {
    *copy = 0;
    ssl_local = (SSL *)std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release
                                 (&pTVar2->session);
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pTVar2->pending_session);
    if (bVar1) {
      ssl_local = (SSL *)SSL_magic_pending_session_ptr();
    }
    else {
      ssl_local = (SSL *)0x0;
    }
  }
  return (SSL_SESSION *)ssl_local;
}

Assistant:

static SSL_SESSION *GetSessionCallback(SSL *ssl, const uint8_t *data, int len,
                                       int *copy) {
  TestState *async_state = GetTestState(ssl);
  if (async_state->session) {
    *copy = 0;
    return async_state->session.release();
  } else if (async_state->pending_session) {
    return SSL_magic_pending_session_ptr();
  } else {
    return NULL;
  }
}